

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool QMetaType::hasRegisteredConverterFunction(QMetaType fromType,QMetaType toType)

{
  pair<int,_int> k;
  bool bVar1;
  int iVar2;
  int iVar3;
  Type *this;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  pair<int,_int> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
         ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
                       *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar4 = 0;
  iVar2 = id((QMetaType *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  iVar3 = id((QMetaType *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  std::pair<int,_int>::pair<int,_int,_true>
            (local_20,(int *)&stack0xffffffffffffffdc,(int *)&stack0xffffffffffffffd8);
  k.second = iVar2;
  k.first = iVar3;
  bVar1 = QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
          ::contains(this,k);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaType::hasRegisteredConverterFunction(QMetaType fromType, QMetaType toType)
{
    return customTypesConversionRegistry()->contains({fromType.id(), toType.id()});
}